

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::ClassType::handleExtends
          (ClassType *this,ExtendsClauseSyntax *extendsClause,ASTContext *context,
          function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  Scope *pSVar1;
  NameSyntax *className;
  Compilation *pCVar2;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  *this_00;
  bool bVar3;
  SymbolKind SVar4;
  SubroutineSymbol *baseSub;
  ClassType *pCVar5;
  Diagnostic *pDVar6;
  iterator iVar7;
  TransparentMemberSymbol *pTVar8;
  Symbol *pSVar9;
  SubroutineSymbol *derivedMethod;
  SubroutineSymbol *pSVar10;
  Type *pTVar11;
  char *pcVar12;
  ClassType *pCVar13;
  DiagCode code;
  ConstraintBlockSymbol *cb;
  iterator iVar14;
  SourceRange SVar15;
  iterator __begin2;
  iterator local_60;
  ASTContext *local_58;
  Compilation *local_50;
  Scope *local_48;
  intptr_t local_40;
  _func_void_intptr_t_Symbol_ptr *local_38;
  
  local_38 = insertCB.callback;
  pSVar1 = (context->scope).ptr;
  if (pSVar1 == (Scope *)0x0) {
LAB_003d4998:
    pcVar12 = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
  }
  else {
    className = (extendsClause->baseName).ptr;
    if (className != (NameSyntax *)0x0) {
      pCVar2 = pSVar1->compilation;
      pCVar5 = Lookup::findClass(className,context,(optional<slang::DiagCode>)0x0);
      if (pCVar5 == (ClassType *)0x0) {
        pTVar11 = pCVar2->errorType;
LAB_003d4963:
        this->baseClass = pTVar11;
      }
      else {
        pCVar13 = pCVar5;
        local_50 = pCVar2;
        local_40 = insertCB.callable;
        if (pCVar5->isInterface != false) {
          this->baseClass = pCVar2->errorType;
          SVar15 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
          pDVar6 = ASTContext::addDiag(context,(DiagCode)0x240006,SVar15);
          Diagnostic::operator<<(pDVar6,(pCVar5->super_Type).super_Symbol.name);
          return;
        }
        do {
          if (pCVar13 == this) {
            SVar15 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
            pDVar6 = ASTContext::addDiag(context,(DiagCode)0x20009,SVar15);
            Diagnostic::operator<<(pDVar6,(this->super_Type).super_Symbol.name);
            pTVar11 = local_50->errorType;
            goto LAB_003d4963;
          }
          if ((pCVar13->super_Scope).deferredMemberIndex != Invalid) {
            Scope::elaborate(&pCVar13->super_Scope);
          }
          pTVar11 = pCVar13->baseClass;
          if (pTVar11 == (Type *)0x0) goto LAB_003d44ab;
          pCVar13 = (ClassType *)pTVar11->canonical;
          if (pCVar13 == (ClassType *)0x0) {
            Type::resolveCanonical(pTVar11);
            pCVar13 = (ClassType *)pTVar11->canonical;
          }
          SVar4 = (pCVar13->super_Type).super_Symbol.kind;
        } while (SVar4 == ClassType);
        if (SVar4 != ErrorType) {
LAB_003d4979:
          pcVar12 = "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::ClassType]";
LAB_003d498e:
          assert::assertFailed
                    ("T::isKind(kind)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                     ,0xc4,pcVar12);
        }
LAB_003d44ab:
        this->baseClass = &pCVar5->super_Type;
        pSVar1 = &this->super_Scope;
        local_58 = context;
        if ((this->super_Scope).deferredMemberIndex != Invalid) {
          Scope::elaborate(pSVar1);
        }
        this_00 = &((this->super_Scope).nameMap)->
                   super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
        ;
        local_48 = pSVar1;
        if ((pCVar5->super_Scope).deferredMemberIndex != Invalid) {
          Scope::elaborate(&pCVar5->super_Scope);
        }
        local_60.current = (pCVar5->super_Scope).firstMember;
        if ((MethodPrototypeSymbol *)local_60.current != (MethodPrototypeSymbol *)0x0) {
          bVar3 = false;
          do {
            iVar14.current = local_60.current;
            if (((local_60.current)->name)._M_len != 0) {
              SVar4 = ((Symbol *)&(local_60.current)->kind)->kind;
              if (SVar4 == MethodPrototype) {
                if (((ulong)local_60.current[2].originatingSyntax & 8) == 0) goto LAB_003d4544;
                pSVar10 = MethodPrototypeSymbol::getSubroutine
                                    ((MethodPrototypeSymbol *)local_60.current);
                this->baseConstructor = &pSVar10->super_Symbol;
              }
              else if ((SVar4 == Subroutine) &&
                      (((ulong)local_60.current[2].originatingSyntax & 0x800000000) != 0)) {
                this->baseConstructor = local_60.current;
              }
              else {
LAB_003d4544:
                iVar7 = ska::detailv3::
                        sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                        ::find(this_00,&(local_60.current)->name);
                if (iVar7.current ==
                    this_00->entries + this_00->num_slots_minus_one + (long)this_00->max_lookups) {
                  if (((Symbol *)&(iVar14.current)->kind)->kind == TransparentMember) {
                    iVar14.current = iVar14.current[1];
                  }
                  if (this->isAbstract == false) {
                    SVar4 = ((Symbol *)&(iVar14.current)->kind)->kind;
                    if (SVar4 == MethodPrototype) {
                      if (((((MethodPrototypeSymbol *)iVar14.current)->flags).m_bits & 2) == 0) {
                        SVar4 = ((Symbol *)&(iVar14.current)->kind)->kind;
                        goto LAB_003d45a0;
                      }
                      if (bVar3) goto LAB_003d45f4;
                      SVar15 = slang::syntax::SyntaxNode::sourceRange
                                         (&extendsClause->super_SyntaxNode);
                      code.subsystem = Declarations;
                      code.code = 0x35;
                    }
                    else {
LAB_003d45a0:
                      if ((SVar4 != ConstraintBlock) ||
                         (*(char *)((long)&(((MethodPrototypeSymbol *)iVar14.current)->
                                           declaredReturnType).type + 3) != '\x01'))
                      goto LAB_003d45ca;
                      if (bVar3) goto LAB_003d45f4;
                      SVar15 = slang::syntax::SyntaxNode::sourceRange
                                         (&extendsClause->super_SyntaxNode);
                      code.subsystem = Declarations;
                      code.code = 0x36;
                    }
                    pDVar6 = ASTContext::addDiag(local_58,code,SVar15);
                    Diagnostic::operator<<(pDVar6,(this->super_Type).super_Symbol.name);
                    Diagnostic::operator<<(pDVar6,(pCVar5->super_Type).super_Symbol.name);
                    Diagnostic::operator<<(pDVar6,((Symbol *)&(iVar14.current)->kind)->name);
                    Diagnostic::addNote(pDVar6,(DiagCode)0x40001,
                                        ((Symbol *)&(iVar14.current)->kind)->location);
                    bVar3 = true;
                  }
                  else {
LAB_003d45ca:
                    pTVar8 = BumpAllocator::
                             emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                                       (&local_50->super_BumpAllocator,iVar14.current);
                    (*local_38)(local_40,&pTVar8->super_Symbol);
                  }
                }
              }
            }
LAB_003d45f4:
            Scope::iterator::operator++(&local_60);
          } while ((MethodPrototypeSymbol *)local_60.current != (MethodPrototypeSymbol *)0x0);
        }
        if ((this->super_Scope).deferredMemberIndex != Invalid) {
          Scope::elaborate(local_48);
        }
        local_60.current = (this->super_Scope).firstMember;
        if ((SubroutineSymbol *)local_60.current != (SubroutineSymbol *)0x0) {
          do {
            iVar14.current = local_60.current;
            SVar4 = ((Symbol *)&(local_60.current)->kind)->kind;
            if (SVar4 == Subroutine) {
              pCVar13 = pCVar5;
              if (((ulong)local_60.current[2].originatingSyntax & 0xc00000000) == 0) {
                do {
                  pSVar10 = (SubroutineSymbol *)
                            Scope::find(&pCVar13->super_Scope,(iVar14.current)->name);
                  if (pSVar10 != (SubroutineSymbol *)0x0) {
                    if (((pSVar10->super_Symbol).kind == Subroutine) &&
                       ((((pSVar10->flags).m_bits & 1) != 0 ||
                        (pSVar10->overrides != (SubroutineSymbol *)0x0)))) {
                      SubroutineSymbol::setOverride((SubroutineSymbol *)iVar14.current,pSVar10);
                    }
                    goto LAB_003d4914;
                  }
                  if ((pCVar13->super_Scope).deferredMemberIndex != Invalid) {
                    Scope::elaborate(&pCVar13->super_Scope);
                  }
                  pTVar11 = pCVar13->baseClass;
                  if (pTVar11 == (Type *)0x0) goto LAB_003d4914;
                  pCVar13 = (ClassType *)pTVar11->canonical;
                  if (pCVar13 == (ClassType *)0x0) {
                    Type::resolveCanonical(pTVar11);
                    pCVar13 = (ClassType *)pTVar11->canonical;
                  }
                  SVar4 = (pCVar13->super_Type).super_Symbol.kind;
                } while (SVar4 == ClassType);
LAB_003d47f7:
                if (SVar4 != ErrorType) goto LAB_003d4979;
              }
            }
            else if (SVar4 == MethodPrototype) {
              pCVar13 = pCVar5;
              if (((ulong)local_60.current[2].originatingSyntax & 0xc) == 0) {
                do {
                  pSVar9 = Scope::find(&pCVar13->super_Scope,(iVar14.current)->name);
                  if (pSVar9 != (Symbol *)0x0) {
                    if ((pSVar9->kind == Subroutine) &&
                       ((((ulong)pSVar9[2].originatingSyntax & 0x100000000) != 0 ||
                        (*(long *)(pSVar9 + 4) != 0)))) {
                      iVar14.current[3].parentScope = (Scope *)pSVar9;
                    }
                    goto LAB_003d4738;
                  }
                  if ((pCVar13->super_Scope).deferredMemberIndex != Invalid) {
                    Scope::elaborate(&pCVar13->super_Scope);
                  }
                  pTVar11 = pCVar13->baseClass;
                  if (pTVar11 == (Type *)0x0) goto LAB_003d4738;
                  pCVar13 = (ClassType *)pTVar11->canonical;
                  if (pCVar13 == (ClassType *)0x0) {
                    Type::resolveCanonical(pTVar11);
                    pCVar13 = (ClassType *)pTVar11->canonical;
                  }
                  SVar4 = (pCVar13->super_Type).super_Symbol.kind;
                } while (SVar4 == ClassType);
                if (SVar4 != ErrorType) goto LAB_003d4979;
              }
LAB_003d4738:
              pSVar10 = (SubroutineSymbol *)iVar14.current[3].parentScope;
              if ((pSVar10 != (SubroutineSymbol *)0x0) &&
                 (derivedMethod =
                       MethodPrototypeSymbol::getSubroutine((MethodPrototypeSymbol *)iVar14.current)
                 , derivedMethod != (SubroutineSymbol *)0x0)) {
                pSVar1 = (local_58->scope).ptr;
                if (pSVar1 == (Scope *)0x0) goto LAB_003d4998;
                if ((pSVar10->super_Symbol).kind != Subroutine) {
                  pcVar12 = 
                  "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::SubroutineSymbol]";
                  goto LAB_003d498e;
                }
                SubroutineSymbol::checkVirtualMethodMatch(pSVar1,pSVar10,derivedMethod,true);
              }
            }
            else {
              pCVar13 = pCVar5;
              if (SVar4 == ConstraintBlock) {
                do {
                  pSVar9 = Scope::find(&pCVar13->super_Scope,(iVar14.current)->name);
                  if (pSVar9 != (Symbol *)0x0) {
                    if ((pSVar9->kind != ConstraintBlock) ||
                       (*(char *)((long)&pSVar9[1].originatingSyntax + 3) != '\x01'))
                    goto LAB_003d4914;
                    if (((Symbol *)&(iVar14.current)->kind)->kind != ConstraintBlock) {
                      pcVar12 = 
                      "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::ConstraintBlockSymbol]"
                      ;
                      goto LAB_003d498e;
                    }
                    if (*(char *)&pSVar9[1].originatingSyntax !=
                        *(char *)&iVar14.current[1].originatingSyntax) {
                      pDVar6 = ASTContext::addDiag(local_58,(DiagCode)0x5c0006,
                                                   (iVar14.current)->location);
                      Diagnostic::addNote(pDVar6,(DiagCode)0x40001,pSVar9->location);
                    }
                    goto LAB_003d4914;
                  }
                  if ((pCVar13->super_Scope).deferredMemberIndex != Invalid) {
                    Scope::elaborate(&pCVar13->super_Scope);
                  }
                  pTVar11 = pCVar13->baseClass;
                  if (pTVar11 == (Type *)0x0) goto LAB_003d4914;
                  pCVar13 = (ClassType *)pTVar11->canonical;
                  if (pCVar13 == (ClassType *)0x0) {
                    Type::resolveCanonical(pTVar11);
                    pCVar13 = (ClassType *)pTVar11->canonical;
                  }
                  SVar4 = (pCVar13->super_Type).super_Symbol.kind;
                } while (SVar4 == ClassType);
                goto LAB_003d47f7;
              }
            }
LAB_003d4914:
            Scope::iterator::operator++(&local_60);
          } while ((SubroutineSymbol *)local_60.current != (SubroutineSymbol *)0x0);
        }
      }
      return;
    }
    pcVar12 = 
    "T slang::not_null<slang::syntax::NameSyntax *>::get() const [T = slang::syntax::NameSyntax *]";
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,pcVar12);
}

Assistant:

void ClassType::handleExtends(const ExtendsClauseSyntax& extendsClause, const ASTContext& context,
                              function_ref<void(const Symbol&)> insertCB) const {
    auto& comp = context.getCompilation();
    auto baseType = Lookup::findClass(*extendsClause.baseName, context);
    if (!baseType) {
        baseClass = &comp.getErrorType();
        return;
    }

    // A normal class can't extend an interface class. This method won't be called
    // for an interface class, so we don't need to check that again here.
    if (baseType->isInterface) {
        baseClass = &comp.getErrorType();
        context.addDiag(diag::ExtendIfaceFromClass, extendsClause.sourceRange()) << baseType->name;
        return;
    }

    // Make sure there are no cycles in the inheritance chain.
    auto currBase = baseType;
    while (true) {
        if (currBase == this) {
            context.addDiag(diag::ClassInheritanceCycle, extendsClause.sourceRange()) << name;
            baseClass = &comp.getErrorType();
            return;
        }

        auto next = currBase->getBaseClass();
        if (!next || next->isError())
            break;

        currBase = &next->getCanonicalType().as<ClassType>();
    }

    // Assign this member before resolving anything below, because they
    // may try to check the base class of this type.
    baseClass = baseType;

    // Inherit all base class members that don't conflict with our declared symbols.
    auto& scopeNameMap = getNameMap();
    bool pureVirtualError = false;

    for (auto& member : baseType->members()) {
        if (member.name.empty())
            continue;

        // Don't inherit constructors.
        if (member.kind == SymbolKind::Subroutine &&
            member.as<SubroutineSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = &member;
            continue;
        }
        if (member.kind == SymbolKind::MethodPrototype &&
            member.as<MethodPrototypeSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = member.as<MethodPrototypeSymbol>().getSubroutine();
            continue;
        }

        // Don't inherit if the member is already overridden.
        if (auto it = scopeNameMap.find(member.name); it != scopeNameMap.end())
            continue;

        // If the symbol itself was already inherited, create a new wrapper around
        // it for our own scope.
        const Symbol* toWrap = &member;
        if (member.kind == SymbolKind::TransparentMember)
            toWrap = &member.as<TransparentMemberSymbol>().wrapped;

        // If this is a pure virtual method being inherited and we aren't ourselves
        // an abstract class, issue an error.
        if (!isAbstract && toWrap->kind == SymbolKind::MethodPrototype) {
            auto& sub = toWrap->as<MethodPrototypeSymbol>();
            if (sub.flags & MethodFlags::Pure) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstract,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << sub.name;
                    diag.addNote(diag::NoteDeclarationHere, sub.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        if (!isAbstract && toWrap->kind == SymbolKind::ConstraintBlock) {
            auto& cb = toWrap->as<ConstraintBlockSymbol>();
            if (cb.isPure) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstractConstraint,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << cb.name;
                    diag.addNote(diag::NoteDeclarationHere, cb.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        // All symbols get inserted into the beginning of the scope using the
        // provided insertion callback. We insert them as TransparentMemberSymbols
        // so that we can trace a path back to the actual location they are declared.
        auto wrapper = comp.emplace<TransparentMemberSymbol>(*toWrap);
        insertCB(*wrapper);
    }

    auto checkForOverride = [&](auto& member) {
        // Constructors and static methods can never be virtual.
        if (member.flags.has(MethodFlags::Constructor | MethodFlags::Static))
            return;

        // Look in the parent class for a method with the same name.
        auto currentBase = baseType;
        while (true) {
            const Symbol* found = currentBase->find(member.name);
            if (found) {
                if (found->kind == SymbolKind::Subroutine) {
                    auto& baseSub = found->as<SubroutineSymbol>();
                    if (baseSub.isVirtual())
                        member.setOverride(baseSub);
                }
                break;
            }

            // Otherwise it could be inherited from a higher-level base.
            auto possibleBase = currentBase->getBaseClass();
            if (!possibleBase || possibleBase->isError())
                break;

            currentBase = &possibleBase->getCanonicalType().as<ClassType>();
        }
    };

    // Check all methods in our class for overriding virtual methods in parent classes.
    for (auto& member : members()) {
        if (member.kind == SymbolKind::Subroutine)
            checkForOverride(member.as<SubroutineSymbol>());
        else if (member.kind == SymbolKind::MethodPrototype) {
            auto& proto = member.as<MethodPrototypeSymbol>();
            checkForOverride(proto);

            if (auto baseSub = proto.getOverride()) {
                if (auto protoSub = proto.getSubroutine()) {
                    SubroutineSymbol::checkVirtualMethodMatch(*context.scope,
                                                              baseSub->as<SubroutineSymbol>(),
                                                              *protoSub,
                                                              /* allowDerivedReturn */ true);
                }
            }
        }
        else if (member.kind == SymbolKind::ConstraintBlock) {
            // Constraint blocks can also be overridden -- check that 'static'ness
            // matches between base and derived if the base is pure.
            auto currentBase = baseType;
            while (true) {
                const Symbol* found = currentBase->find(member.name);
                if (found) {
                    if (found->kind == SymbolKind::ConstraintBlock) {
                        auto& baseConstraint = found->as<ConstraintBlockSymbol>();
                        if (baseConstraint.isPure &&
                            baseConstraint.isStatic !=
                                member.as<ConstraintBlockSymbol>().isStatic) {
                            auto& diag = context.addDiag(diag::MismatchStaticConstraint,
                                                         member.location);
                            diag.addNote(diag::NoteDeclarationHere, found->location);
                        }
                    }
                    break;
                }

                // Otherwise it could be inherited from a higher-level base.
                auto possibleBase = currentBase->getBaseClass();
                if (!possibleBase || possibleBase->isError())
                    break;

                currentBase = &possibleBase->getCanonicalType().as<ClassType>();
            }
        }
    }
}